

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

_Bool load(DATA_ENTRY *d,int id,char *type,char *path,char *subfolder,char *name,char *ext,int size)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  
  sprintf(load::spath,"%s/%s/%s.%s",data_path);
  printf("Loading %s...\n",load::spath);
  iVar1 = strcmp(type,"font");
  if (iVar1 == 0) {
    pvVar2 = (void *)al_load_font(load::spath,0,0);
    d[id].dat = pvVar2;
  }
  iVar1 = strcmp(type,"bitmap");
  if (iVar1 == 0) {
    pvVar2 = (void *)al_load_bitmap(load::spath);
    d[id].dat = pvVar2;
  }
  iVar1 = strcmp(type,"sample");
  if (iVar1 == 0) {
    pvVar2 = (void *)al_load_sample(load::spath);
    d[id].dat = pvVar2;
  }
  iVar1 = strcmp(type,"music");
  if (iVar1 == 0) {
    pvVar2 = (void *)al_load_audio_stream(load::spath,2,0x1000);
    d[id].dat = pvVar2;
  }
  else {
    pvVar2 = d[id].dat;
  }
  if (pvVar2 == (void *)0x0) {
    printf("Failed loading %s.\n",subfolder);
  }
  d[id].type = type;
  pcVar3 = strdup(data_path);
  d[id].path = pcVar3;
  pcVar3 = strdup(path);
  d[id].subfolder = pcVar3;
  pcVar3 = strdup(subfolder);
  d[id].name = pcVar3;
  pcVar3 = strdup(name);
  d[id].ext = pcVar3;
  d[id].size = 0;
  return SUB81(pcVar3,0);
}

Assistant:

static bool load(DATA_ENTRY *d, int id, char const *type, char const *path,
   char const *subfolder, char const *name, char const *ext, int size)
{
   static char spath[1024];
   sprintf(spath, "%s/%s/%s.%s", path, subfolder, name, ext);
   printf("Loading %s...\n", spath);
   if (!strcmp(type, "font")) d[id].dat = al_load_font(spath, size, 0);
   if (!strcmp(type, "bitmap")) d[id].dat = al_load_bitmap(spath);
   if (!strcmp(type, "sample")) d[id].dat = al_load_sample(spath);
   if (!strcmp(type, "music")) d[id].dat = al_load_audio_stream(spath, 2, 4096);
   if (d[id].dat == NULL) {
      printf("Failed loading %s.\n", name);
   }
   d[id].type = type;
   d[id].path = strdup(path);
   d[id].subfolder = strdup(subfolder);
   d[id].name = strdup(name);
   d[id].ext = strdup(ext);
   d[id].size = size;
   return d[id].dat != NULL;
}